

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,string *language,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  bool bVar1;
  pointer parent;
  string *psVar2;
  cmMakefile *mf;
  cmLocalGenerator *pcVar3;
  pointer pcVar4;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *this_00;
  reference ppcVar5;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar6;
  cmGeneratorTarget *local_a80;
  cmGeneratorTarget *target;
  iterator __end1;
  iterator __begin1;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range1;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *allTargets;
  undefined1 local_a50 [8];
  cmGeneratorTarget gDummyHead;
  string local_188;
  cmTarget local_168;
  cmTarget dummyHead;
  undefined1 local_140 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_118 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  void *local_90;
  unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
  local_88;
  unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
  local_80;
  unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
  parentDagChecker;
  cmListFileBacktrace local_68;
  undefined1 local_50 [8];
  cmGeneratorExpression ge;
  cmValue prop;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *emitted_local;
  string *language_local;
  cmGeneratorTarget *tgt_local;
  string *propName_local;
  cmExportTryCompileFileGenerator *this_local;
  string *result;
  
  language_local = (string *)tgt;
  tgt_local = (cmGeneratorTarget *)propName;
  propName_local = (string *)this;
  this_local = (cmExportTryCompileFileGenerator *)__return_storage_ptr__;
  ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cmGeneratorTarget::GetProperty(tgt,propName);
  bVar1 = cmValue::operator_cast_to_bool
                    ((cmValue *)
                     &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  if (bVar1) {
    local_68.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_68.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_68);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_50,&local_68);
    cmListFileBacktrace::~cmListFileBacktrace(&local_68);
    std::
    unique_ptr<cmGeneratorExpressionDAGChecker,std::default_delete<cmGeneratorExpressionDAGChecker>>
    ::unique_ptr<std::default_delete<cmGeneratorExpressionDAGChecker>,void>
              ((unique_ptr<cmGeneratorExpressionDAGChecker,std::default_delete<cmGeneratorExpressionDAGChecker>>
                *)&local_80);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            tgt_local,"INTERFACE_LINK_OPTIONS");
    if (bVar1) {
      local_90 = (void *)0x0;
      dagChecker.CheckResult = DAG;
      dagChecker.TransitivePropertiesOnly = false;
      dagChecker._125_3_ = 0;
      std::
      make_unique<cmGeneratorExpressionDAGChecker,cmGeneratorTarget_const*&,char_const(&)[13],decltype(nullptr),decltype(nullptr)>
                ((cmGeneratorTarget **)&local_88,(char (*) [13])&language_local,(void **)0xc85090,
                 &local_90);
      std::
      unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
      ::operator=(&local_80,&local_88);
      std::
      unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
      ::~unique_ptr(&local_88);
    }
    psVar2 = language_local;
    std::__cxx11::string::string((string *)&cge,(string *)tgt_local);
    parent = std::
             unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
             ::get(&local_80);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_118,(cmGeneratorTarget *)psVar2,
               (string *)&cge,(GeneratorExpressionContent *)0x0,parent);
    std::__cxx11::string::~string((string *)&cge);
    psVar2 = cmValue::operator*[abi_cxx11_
                       ((cmValue *)
                        &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                         TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
    std::__cxx11::string::string((string *)&dummyHead,(string *)psVar2);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_140,(string *)local_50);
    std::__cxx11::string::~string((string *)&dummyHead);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"try_compile_dummy_exe",
               (allocator<char> *)
               ((long)&gDummyHead.MaxLanguageStandards._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    mf = cmTarget::GetMakefile(*(cmTarget **)language_local);
    cmTarget::cmTarget(&local_168,&local_188,EXECUTABLE,VisibilityNormal,mf,Yes);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gDummyHead.MaxLanguageStandards._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    pcVar3 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)language_local);
    cmGeneratorTarget::cmGeneratorTarget((cmGeneratorTarget *)local_a50,&local_168,pcVar3);
    pcVar4 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_140);
    pcVar3 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)language_local);
    psVar2 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar4,pcVar3,&this->Config,(cmGeneratorTarget *)local_a50,
                        (cmGeneratorExpressionDAGChecker *)local_118,
                        (cmGeneratorTarget *)language_local,language);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    pcVar4 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_140);
    this_00 = cmCompiledGeneratorExpression::GetAllTargetsSeen(pcVar4);
    __end1 = std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::begin(this_00);
    target = (cmGeneratorTarget *)
             std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::end(this_00);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&target), bVar1) {
      ppcVar5 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end1);
      local_a80 = *ppcVar5;
      pVar6 = std::
              set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              ::insert(emitted,&local_a80);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
        push_back(&this->Exports,&local_a80);
      }
      std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end1);
    }
    cmGeneratorTarget::~cmGeneratorTarget((cmGeneratorTarget *)local_a50);
    cmTarget::~cmTarget(&local_168);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_140);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_118);
    std::
    unique_ptr<cmGeneratorExpressionDAGChecker,_std::default_delete<cmGeneratorExpressionDAGChecker>_>
    ::~unique_ptr(&local_80);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_50);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
  const std::string& propName, cmGeneratorTarget const* tgt,
  std::string const& language, std::set<cmGeneratorTarget const*>& emitted)
{
  cmValue prop = tgt->GetProperty(propName);
  if (!prop) {
    return std::string();
  }

  cmGeneratorExpression ge;

  std::unique_ptr<cmGeneratorExpressionDAGChecker> parentDagChecker;
  if (propName == "INTERFACE_LINK_OPTIONS") {
    // To please constraint checks of DAGChecker, this property must have
    // LINK_OPTIONS property as parent
    parentDagChecker = cm::make_unique<cmGeneratorExpressionDAGChecker>(
      tgt, "LINK_OPTIONS", nullptr, nullptr);
  }
  cmGeneratorExpressionDAGChecker dagChecker(tgt, propName, nullptr,
                                             parentDagChecker.get());

  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(*prop);

  cmTarget dummyHead("try_compile_dummy_exe", cmStateEnums::EXECUTABLE,
                     cmTarget::VisibilityNormal, tgt->Target->GetMakefile(),
                     cmTarget::PerConfig::Yes);

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result = cge->Evaluate(tgt->GetLocalGenerator(), this->Config,
                                     &gDummyHead, &dagChecker, tgt, language);

  const std::set<cmGeneratorTarget const*>& allTargets =
    cge->GetAllTargetsSeen();
  for (cmGeneratorTarget const* target : allTargets) {
    if (emitted.insert(target).second) {
      this->Exports.push_back(target);
    }
  }
  return result;
}